

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

BinaryRegionType flatbuffers::GetRegionType(BaseType base_type)

{
  BinaryRegionType local_c;
  BaseType base_type_local;
  
  switch(base_type) {
  case UType:
    local_c = UType;
    break;
  case Bool:
    local_c = Uint8;
    break;
  case Byte:
    local_c = Uint8;
    break;
  case UByte:
    local_c = Uint8;
    break;
  case Short:
    local_c = Int16;
    break;
  case UShort:
    local_c = Uint16;
    break;
  case Int:
    local_c = Uint32;
    break;
  case UInt:
    local_c = Uint32;
    break;
  case Long:
    local_c = Int64;
    break;
  case ULong:
    local_c = Uint64;
    break;
  case Float:
    local_c = Float;
    break;
  case Double:
    local_c = Double;
    break;
  default:
    local_c = Unknown;
  }
  return local_c;
}

Assistant:

inline static BinaryRegionType GetRegionType(reflection::BaseType base_type) {
  switch (base_type) {
    case reflection::UType: return BinaryRegionType::UType;
    case reflection::Bool: return BinaryRegionType::Uint8;
    case reflection::Byte: return BinaryRegionType::Uint8;
    case reflection::UByte: return BinaryRegionType::Uint8;
    case reflection::Short: return BinaryRegionType::Int16;
    case reflection::UShort: return BinaryRegionType::Uint16;
    case reflection::Int: return BinaryRegionType::Uint32;
    case reflection::UInt: return BinaryRegionType::Uint32;
    case reflection::Long: return BinaryRegionType::Int64;
    case reflection::ULong: return BinaryRegionType::Uint64;
    case reflection::Float: return BinaryRegionType::Float;
    case reflection::Double: return BinaryRegionType::Double;
    default: return BinaryRegionType::Unknown;
  }
}